

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O2

void removeAllComparatorsAndCopiers_c(void)

{
  MockCFunctionComparatorNode *pMVar1;
  MockCFunctionCopierNode *pMVar2;
  
  while (comparatorList_ != (MockCFunctionComparatorNode *)0x0) {
    pMVar1 = comparatorList_->next_;
    (*(comparatorList_->super_MockNamedValueComparator)._vptr_MockNamedValueComparator[1])();
    comparatorList_ = pMVar1;
  }
  while (copierList_ != (MockCFunctionCopierNode *)0x0) {
    pMVar2 = copierList_->next_;
    (*(copierList_->super_MockNamedValueCopier)._vptr_MockNamedValueCopier[1])();
    copierList_ = pMVar2;
  }
  (*currentMockSupport->_vptr_MockSupport[0x2f])();
  return;
}

Assistant:

static void removeAllComparatorsAndCopiers_c()
{
    while (comparatorList_) {
        MockCFunctionComparatorNode *next = comparatorList_->next_;
        delete comparatorList_;
        comparatorList_ = next;
    }
    while (copierList_) {
        MockCFunctionCopierNode *next = copierList_->next_;
        delete copierList_;
        copierList_ = next;
    }
    currentMockSupport->removeAllComparatorsAndCopiers();
}